

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O1

size_t Curl_ftp_parselist(char *buffer,size_t size,size_t nmemb,void *connptr)

{
  size_t *psVar1;
  uint *puVar2;
  byte bVar3;
  int *piVar4;
  size_t sVar5;
  long lVar6;
  bool bVar7;
  uint uVar8;
  curlfiletype cVar9;
  CURLofft CVar10;
  int iVar11;
  int iVar12;
  char *pcVar13;
  fileinfo *pfVar14;
  void *pvVar15;
  long lVar16;
  size_t __n;
  ulong uVar17;
  uint c;
  ulong uVar18;
  byte *pbVar19;
  byte *pbVar20;
  char *p;
  curl_off_t fsize;
  size_t local_50;
  char *local_48;
  size_t local_40;
  long local_38;
  
  uVar18 = size * nmemb;
  piVar4 = (int *)**(undefined8 **)(*connptr + 0x15d0);
  local_50 = uVar18;
  if (piVar4[3] == 0) {
    if ((uVar18 != 0) && (*piVar4 == 0)) {
      *piVar4 = ((byte)(*buffer - 0x30U) < 10) + 1;
    }
    if (uVar18 != 0) {
      local_40 = uVar18 + 1;
      uVar17 = 0;
      do {
        bVar3 = buffer[uVar17];
        if (*(long *)(piVar4 + 4) == 0) {
          pfVar14 = Curl_fileinfo_alloc();
          *(fileinfo **)(piVar4 + 4) = pfVar14;
          if (pfVar14 != (fileinfo *)0x0) {
            pvVar15 = (*Curl_cmalloc)(0xa0);
            lVar16 = *(long *)(piVar4 + 4);
            *(void **)(lVar16 + 0x68) = pvVar15;
            if (pvVar15 != (void *)0x0) {
              *(undefined8 *)(lVar16 + 0x70) = 0xa0;
              piVar4[8] = 0;
              piVar4[9] = 0;
              piVar4[6] = 0;
              goto LAB_00126873;
            }
          }
          piVar4[3] = 0x1b;
          iVar12 = 2;
          goto LAB_00127419;
        }
LAB_00126873:
        pfVar14 = *(fileinfo **)(piVar4 + 4);
        sVar5 = (pfVar14->info).b_used;
        (pfVar14->info).b_used = sVar5 + 1;
        (pfVar14->info).b_data[sVar5] = bVar3;
        sVar5 = (pfVar14->info).b_size;
        if (sVar5 - 1 <= (pfVar14->info).b_used) {
          pcVar13 = (char *)(*Curl_crealloc)((pfVar14->info).b_data,sVar5 + 0xa0);
          if (pcVar13 == (char *)0x0) {
            Curl_fileinfo_cleanup(*(fileinfo **)(piVar4 + 4));
            piVar4[4] = 0;
            piVar4[5] = 0;
            piVar4[3] = 0x1b;
            iVar12 = 2;
            goto LAB_00127419;
          }
          psVar1 = &(pfVar14->info).b_size;
          *psVar1 = *psVar1 + 0xa0;
          (pfVar14->info).b_data = pcVar13;
        }
        iVar12 = 2;
        uVar8 = (uint)bVar3;
        if (*piVar4 == 2) {
          switch(piVar4[1]) {
          case 0:
            uVar8 = piVar4[6] + 1;
            piVar4[6] = uVar8;
            if (uVar8 < 9) {
              __n = 0xc;
              pcVar13 = "0123456789-";
LAB_00126e76:
              pvVar15 = memchr(pcVar13,(int)(char)bVar3,__n);
              if (pvVar15 == (void *)0x0) goto LAB_00126e84;
            }
            else {
              if ((uVar8 != 9) || (bVar3 != 0x20)) {
                piVar4[3] = 0x57;
                iVar12 = 2;
                goto LAB_00127419;
              }
              piVar4[1] = 1;
              piVar4[2] = 0;
            }
            break;
          case 1:
            iVar11 = piVar4[6];
            piVar4[6] = iVar11 + 1U;
            if (piVar4[2] == 1) {
              if (bVar3 != 0x20) {
                __n = 0xf;
                pcVar13 = "APM0123456789:";
                goto LAB_00126e76;
              }
              *(long *)(piVar4 + 0x10) = *(long *)(piVar4 + 8);
              (pfVar14->info).b_data[((ulong)(iVar11 + 1U) - 1) + *(long *)(piVar4 + 8)] = '\0';
              piVar4[1] = 2;
              piVar4[2] = 0;
LAB_00126dcd:
              piVar4[6] = 0;
            }
            else if ((piVar4[2] == 0) && (iVar12 = Curl_isspace(uVar8), iVar12 == 0))
            goto LAB_00126b00;
            break;
          case 2:
            iVar11 = piVar4[2];
            if (iVar11 != 1) goto LAB_00126d6e;
            iVar12 = piVar4[6];
            piVar4[6] = iVar12 + 1U;
            if (bVar3 == 0x20) {
              (pfVar14->info).b_data[((ulong)(iVar12 + 1U) - 1) + *(long *)(piVar4 + 8)] = '\0';
              pcVar13 = (pfVar14->info).b_data + *(long *)(piVar4 + 8);
              iVar12 = strcmp("<DIR>",pcVar13);
              if (iVar12 == 0) {
                (pfVar14->info).filetype = CURLFILETYPE_DIRECTORY;
                (pfVar14->info).size = 0;
              }
              else {
                CVar10 = curlx_strtoofft(pcVar13,&local_48,10,&(pfVar14->info).size);
                if (CVar10 != CURL_OFFT_OK) {
                  piVar4[3] = 0x57;
                  iVar12 = 2;
                  goto LAB_00127419;
                }
                *(undefined4 *)(*(long *)(piVar4 + 4) + 8) = 0;
              }
              *(uint *)(*(long *)(piVar4 + 4) + 0x60) =
                   *(uint *)(*(long *)(piVar4 + 4) + 0x60) | 0x40;
              piVar4[6] = 0;
              piVar4[1] = 3;
              piVar4[2] = 0;
            }
            break;
          case 3:
            iVar11 = piVar4[2];
            if (iVar11 == 2) {
              if (bVar3 != 10) goto LAB_00126e84;
            }
            else {
              if (iVar11 != 1) goto LAB_00126d6e;
              piVar4[6] = piVar4[6] + 1;
              if (bVar3 != 10) {
                if (bVar3 == 0xd) {
                  piVar4[2] = 2;
                  (pfVar14->info).b_data[(pfVar14->info).b_used - 1] = '\0';
                }
                break;
              }
              *(undefined8 *)(piVar4 + 10) = *(undefined8 *)(piVar4 + 8);
              (pfVar14->info).b_data[(pfVar14->info).b_used - 1] = '\0';
            }
            *(undefined8 *)(piVar4 + 10) = *(undefined8 *)(piVar4 + 8);
            ftp_pl_insert_finfo((connectdata *)connptr,pfVar14);
            piVar4[1] = 0;
            piVar4[2] = 0;
          }
          goto switchD_001269d2_default;
        }
        if (*piVar4 != 1) {
          local_50 = local_40;
          goto LAB_00127419;
        }
        if (9 < (uint)piVar4[1]) goto switchD_001269d2_default;
        c = (uint)bVar3;
        switch(piVar4[1]) {
        case 0:
          if (piVar4[2] == 1) {
            uVar8 = piVar4[6];
            piVar4[6] = uVar8 + 1;
            if (bVar3 == 10) {
              (pfVar14->info).b_data[uVar8] = '\0';
              pcVar13 = (pfVar14->info).b_data;
              iVar11 = strncmp("total ",pcVar13,6);
              if (iVar11 != 0) goto LAB_00126e84;
              pbVar19 = (byte *)(pcVar13 + 5);
              do {
                pbVar20 = pbVar19 + 1;
                pbVar19 = pbVar19 + 1;
                iVar12 = Curl_isspace((uint)*pbVar20);
              } while (iVar12 != 0);
              do {
                pbVar20 = pbVar19;
                iVar12 = Curl_isdigit((uint)*pbVar20);
                pbVar19 = pbVar20 + 1;
              } while (iVar12 != 0);
              if (*pbVar20 != 0) {
                piVar4[3] = 0x57;
                iVar12 = 2;
                goto LAB_00127419;
              }
              piVar4[1] = 1;
              (pfVar14->info).b_used = 0;
            }
            else if (bVar3 == 0xd) {
              piVar4[6] = uVar8;
              psVar1 = &(pfVar14->info).b_used;
              *psVar1 = *psVar1 - 1;
            }
          }
          else if (piVar4[2] == 0) {
            if (bVar3 != 0x74) {
              piVar4[1] = 1;
              (pfVar14->info).b_used = 0;
              iVar12 = 3;
              goto LAB_00127419;
            }
            piVar4[2] = 1;
            piVar4[6] = piVar4[6] + 1;
          }
          break;
        case 1:
          if (c == 99 || bVar3 < 99) {
            if (c == 0x61 || bVar3 < 0x61) {
              cVar9 = CURLFILETYPE_FILE;
              if (bVar3 != 0x2d) {
                if (bVar3 != 0x44) goto LAB_00126e84;
                cVar9 = CURLFILETYPE_DOOR;
              }
            }
            else if (bVar3 == 0x62) {
              cVar9 = CURLFILETYPE_DEVICE_BLOCK;
            }
            else {
              if (bVar3 != 99) goto LAB_00126e84;
              cVar9 = CURLFILETYPE_DEVICE_CHAR;
            }
          }
          else if (bVar3 < 0x70) {
            if (c == 100) {
              cVar9 = CURLFILETYPE_DIRECTORY;
            }
            else {
              if (c != 0x6c) goto LAB_00126e84;
              cVar9 = CURLFILETYPE_SYMLINK;
            }
          }
          else if (bVar3 == 0x70) {
            cVar9 = CURLFILETYPE_NAMEDPIPE;
          }
          else {
            if (c != 0x73) goto LAB_00126e84;
            cVar9 = CURLFILETYPE_SOCKET;
          }
          (pfVar14->info).filetype = cVar9;
          piVar4[1] = 2;
          piVar4[6] = 0;
          piVar4[8] = 1;
          piVar4[9] = 0;
          break;
        case 2:
          uVar8 = piVar4[6] + 1;
          piVar4[6] = uVar8;
          if (uVar8 < 10) {
            __n = 9;
            pcVar13 = "rwx-tTsS";
            goto LAB_00126e76;
          }
          if (uVar8 != 10) break;
          if (bVar3 == 0x20) {
            (pfVar14->info).b_data[10] = '\0';
            lVar16 = *(long *)(piVar4 + 8);
            uVar8 = ftp_pl_get_permission((pfVar14->info).b_data + lVar16);
            if (0xffffff < uVar8) {
              piVar4[3] = 0x57;
              goto LAB_001273b3;
            }
            lVar6 = *(long *)(piVar4 + 4);
            puVar2 = (uint *)(lVar6 + 0x60);
            *puVar2 = *puVar2 | 8;
            *(uint *)(lVar6 + 0x18) = uVar8;
            *(long *)(piVar4 + 0x12) = lVar16;
            piVar4[6] = 0;
            piVar4[1] = 3;
            piVar4[2] = 0;
            iVar12 = 0;
            bVar7 = true;
          }
          else {
            piVar4[3] = 0x57;
LAB_001273b3:
            iVar12 = 2;
            bVar7 = false;
          }
          if (!bVar7) goto LAB_00127419;
          break;
        case 3:
          iVar11 = piVar4[2];
          if (iVar11 == 1) {
            iVar11 = piVar4[6];
            piVar4[6] = iVar11 + 1U;
            if (bVar3 == 0x20) {
              (pfVar14->info).b_data[((ulong)(iVar11 + 1U) - 1) + *(long *)(piVar4 + 8)] = '\0';
              lVar16 = strtol((pfVar14->info).b_data + *(long *)(piVar4 + 8),&local_48,10);
              if ((*local_48 == '\0') && (lVar16 + 0x7fffffffffffffffU < 0xfffffffffffffffe)) {
                lVar6 = *(long *)(piVar4 + 4);
                puVar2 = (uint *)(lVar6 + 0x60);
                *puVar2 = *puVar2 | 0x80;
                *(long *)(lVar6 + 0x30) = lVar16;
              }
              piVar4[6] = 0;
              piVar4[8] = 0;
              piVar4[9] = 0;
              piVar4[1] = 4;
              piVar4[2] = 0;
            }
            else if ((byte)(bVar3 - 0x3a) < 0xf6) goto LAB_00126e84;
          }
          else {
LAB_00126d3a:
            if ((iVar11 == 0) && (bVar3 != 0x20)) {
              if ((byte)(bVar3 - 0x30) < 10) goto LAB_00126d7f;
              goto LAB_00126e84;
            }
          }
          break;
        case 4:
          iVar11 = piVar4[2];
          if (iVar11 == 1) {
            iVar12 = piVar4[6];
            piVar4[6] = iVar12 + 1U;
            if (bVar3 == 0x20) {
              (pfVar14->info).b_data[((ulong)(iVar12 + 1U) - 1) + *(long *)(piVar4 + 8)] = '\0';
              *(undefined8 *)(piVar4 + 0xc) = *(undefined8 *)(piVar4 + 8);
              piVar4[1] = 5;
              piVar4[2] = 0;
LAB_00126d20:
              piVar4[8] = 0;
              piVar4[9] = 0;
              goto LAB_00126dcd;
            }
          }
          else {
LAB_00126d6e:
            if (iVar11 == 0) goto switchD_00126b95_caseD_0;
          }
          break;
        case 5:
          iVar11 = piVar4[2];
          if (iVar11 != 1) goto LAB_00126d6e;
          iVar12 = piVar4[6];
          piVar4[6] = iVar12 + 1U;
          if (bVar3 == 0x20) {
            (pfVar14->info).b_data[((ulong)(iVar12 + 1U) - 1) + *(long *)(piVar4 + 8)] = '\0';
            *(undefined8 *)(piVar4 + 0xe) = *(undefined8 *)(piVar4 + 8);
            piVar4[1] = 6;
            piVar4[2] = 0;
            goto LAB_00126d20;
          }
          break;
        case 6:
          iVar11 = piVar4[2];
          if (iVar11 != 1) goto LAB_00126d3a;
          iVar11 = piVar4[6];
          piVar4[6] = iVar11 + 1U;
          if (bVar3 == 0x20) {
            (pfVar14->info).b_data[((ulong)(iVar11 + 1U) - 1) + *(long *)(piVar4 + 8)] = '\0';
            CVar10 = curlx_strtoofft((pfVar14->info).b_data + *(long *)(piVar4 + 8),&local_48,10,
                                     &local_38);
            if (CVar10 == CURL_OFFT_OK) {
              if (local_38 + 0x7fffffffffffffffU < 0xfffffffffffffffe && *local_48 == '\0') {
                lVar16 = *(long *)(piVar4 + 4);
                puVar2 = (uint *)(lVar16 + 0x60);
                *puVar2 = *puVar2 | 0x40;
                *(long *)(lVar16 + 0x28) = local_38;
              }
              piVar4[6] = 0;
              piVar4[8] = 0;
              piVar4[9] = 0;
              piVar4[1] = 7;
              piVar4[2] = 0;
            }
          }
          else {
            iVar11 = Curl_isdigit(c);
            if (iVar11 == 0) goto LAB_00126e84;
          }
          break;
        case 7:
          switch(piVar4[2]) {
          case 0:
            if (bVar3 != 0x20) {
              iVar11 = Curl_isalnum(c);
              if (iVar11 == 0) goto LAB_00126e84;
              goto LAB_00126d7f;
            }
            break;
          case 1:
            piVar4[6] = piVar4[6] + 1;
            if (bVar3 == 0x20) {
LAB_001270b1:
              piVar4[2] = 2;
            }
            else {
LAB_001270be:
              iVar11 = Curl_isalnum(c);
              if (bVar3 != 0x2e && iVar11 == 0) goto LAB_00126e84;
            }
            break;
          case 2:
            piVar4[6] = piVar4[6] + 1;
            if (bVar3 != 0x20) {
              iVar11 = Curl_isalnum(c);
              if (iVar11 == 0) goto LAB_00126e84;
LAB_001271c1:
              piVar4[2] = 3;
            }
            break;
          case 3:
            piVar4[6] = piVar4[6] + 1;
            if (bVar3 != 0x20) goto LAB_001270be;
LAB_001271f0:
            piVar4[2] = 4;
            break;
          case 4:
            piVar4[6] = piVar4[6] + 1;
            if (bVar3 != 0x20) {
              iVar11 = Curl_isalnum(c);
              if (iVar11 == 0) goto LAB_00126e84;
              piVar4[2] = 5;
            }
            break;
          case 5:
            iVar11 = piVar4[6];
            piVar4[6] = iVar11 + 1U;
            if (bVar3 == 0x20) {
              (pfVar14->info).b_data[((ulong)(iVar11 + 1U) - 1) + *(long *)(piVar4 + 8)] = '\0';
              *(undefined8 *)(piVar4 + 0x10) = *(undefined8 *)(piVar4 + 8);
              if ((pfVar14->info).filetype == CURLFILETYPE_SYMLINK) {
                piVar4[1] = 9;
                piVar4[2] = 0;
              }
              else {
                piVar4[1] = 8;
                piVar4[2] = 0;
              }
            }
            else {
              iVar11 = Curl_isalnum(c);
              if (((iVar11 == 0) && (bVar3 != 0x2e)) && (bVar3 != 0x3a)) goto LAB_00126e84;
            }
          }
          break;
        case 8:
          iVar11 = piVar4[2];
          if (iVar11 == 2) {
            if (bVar3 != 10) goto LAB_00126e84;
            (pfVar14->info).b_data[((ulong)(uint)piVar4[6] - 1) + *(long *)(piVar4 + 8)] = '\0';
          }
          else {
            if (iVar11 != 1) goto LAB_00126d6e;
            iVar12 = piVar4[6];
            piVar4[6] = iVar12 + 1U;
            if (c != 10) {
              if (c == 0xd) goto LAB_001270b1;
              break;
            }
            (pfVar14->info).b_data[((ulong)(iVar12 + 1U) - 1) + *(long *)(piVar4 + 8)] = '\0';
          }
          *(undefined8 *)(piVar4 + 10) = *(undefined8 *)(piVar4 + 8);
          piVar4[1] = 1;
          ftp_pl_insert_finfo((connectdata *)connptr,pfVar14);
          break;
        case 9:
          switch(piVar4[2]) {
          case 0:
switchD_00126b95_caseD_0:
            if (bVar3 != 0x20) {
LAB_00126d7f:
              *(size_t *)(piVar4 + 8) = (pfVar14->info).b_used - 1;
              piVar4[6] = 1;
              piVar4[2] = 1;
            }
            break;
          case 1:
            piVar4[6] = piVar4[6] + 1;
            if ((bVar3 == 10) || (bVar3 == 0xd)) goto LAB_00126e84;
            if (c == 0x20) goto LAB_001270b1;
            break;
          case 2:
            piVar4[6] = piVar4[6] + 1;
            if ((c == 10) || (bVar3 == 0xd)) goto LAB_00126e84;
            if (bVar3 == 0x2d) goto LAB_001271c1;
LAB_00126b00:
            piVar4[2] = 1;
            break;
          case 3:
            piVar4[6] = piVar4[6] + 1;
            if ((bVar3 != 10) && (bVar3 != 0xd)) {
              if (c == 0x3e) goto LAB_001271f0;
              goto LAB_00126b00;
            }
            goto LAB_00126e84;
          case 4:
            iVar11 = piVar4[6];
            piVar4[6] = iVar11 + 1U;
            if ((c == 10) || (bVar3 == 0xd)) goto LAB_00126e84;
            if (bVar3 != 0x20) goto LAB_00126b00;
            piVar4[2] = 5;
            (pfVar14->info).b_data[((ulong)(iVar11 + 1U) - 4) + *(long *)(piVar4 + 8)] = '\0';
            *(undefined8 *)(piVar4 + 10) = *(undefined8 *)(piVar4 + 8);
            piVar4[6] = 0;
            piVar4[8] = 0;
            piVar4[9] = 0;
            break;
          case 5:
            if ((uVar8 == 10) || (c == 0xd)) goto LAB_00126e84;
            piVar4[2] = 6;
            *(size_t *)(piVar4 + 8) = (pfVar14->info).b_used - 1;
            piVar4[6] = 1;
            break;
          case 6:
            iVar12 = piVar4[6];
            piVar4[6] = iVar12 + 1U;
            if (uVar8 == 10) {
              (pfVar14->info).b_data[((ulong)(iVar12 + 1U) - 1) + *(long *)(piVar4 + 8)] = '\0';
LAB_001273ca:
              *(undefined8 *)(piVar4 + 0x14) = *(undefined8 *)(piVar4 + 8);
              ftp_pl_insert_finfo((connectdata *)connptr,pfVar14);
              piVar4[1] = 1;
            }
            else if (uVar8 == 0xd) {
              piVar4[2] = 7;
            }
            break;
          case 7:
            if (bVar3 == 10) {
              (pfVar14->info).b_data[((ulong)(uint)piVar4[6] - 1) + *(long *)(piVar4 + 8)] = '\0';
              goto LAB_001273ca;
            }
LAB_00126e84:
            piVar4[3] = 0x57;
            goto LAB_00127419;
          }
        }
switchD_001269d2_default:
        uVar17 = uVar17 + 1;
        iVar12 = 0;
LAB_00127419:
        if ((iVar12 != 0) && (iVar12 != 3)) {
          if (iVar12 != 2) {
            return local_50;
          }
          goto LAB_00126803;
        }
      } while (uVar17 < uVar18);
    }
  }
  else {
LAB_00126803:
    if (*(fileinfo **)(piVar4 + 4) != (fileinfo *)0x0) {
      Curl_fileinfo_cleanup(*(fileinfo **)(piVar4 + 4));
      piVar4[4] = 0;
      piVar4[5] = 0;
    }
  }
  return local_50;
}

Assistant:

size_t Curl_ftp_parselist(char *buffer, size_t size, size_t nmemb,
                          void *connptr)
{
  size_t bufflen = size*nmemb;
  struct connectdata *conn = (struct connectdata *)connptr;
  struct ftp_wc *ftpwc = conn->data->wildcard.protdata;
  struct ftp_parselist_data *parser = ftpwc->parser;
  struct fileinfo *infop;
  struct curl_fileinfo *finfo;
  unsigned long i = 0;
  CURLcode result;
  size_t retsize = bufflen;

  if(parser->error) { /* error in previous call */
    /* scenario:
     * 1. call => OK..
     * 2. call => OUT_OF_MEMORY (or other error)
     * 3. (last) call => is skipped RIGHT HERE and the error is hadled later
     *    in wc_statemach()
     */
    goto fail;
  }

  if(parser->os_type == OS_TYPE_UNKNOWN && bufflen > 0) {
    /* considering info about FILE response format */
    parser->os_type = (buffer[0] >= '0' && buffer[0] <= '9') ?
                       OS_TYPE_WIN_NT : OS_TYPE_UNIX;
  }

  while(i < bufflen) { /* FSM */

    char c = buffer[i];
    if(!parser->file_data) { /* tmp file data is not allocated yet */
      parser->file_data = Curl_fileinfo_alloc();
      if(!parser->file_data) {
        parser->error = CURLE_OUT_OF_MEMORY;
        goto fail;
      }
      parser->file_data->info.b_data = malloc(FTP_BUFFER_ALLOCSIZE);
      if(!parser->file_data->info.b_data) {
        parser->error = CURLE_OUT_OF_MEMORY;
        goto fail;
      }
      parser->file_data->info.b_size = FTP_BUFFER_ALLOCSIZE;
      parser->item_offset = 0;
      parser->item_length = 0;
    }

    infop = parser->file_data;
    finfo = &infop->info;
    finfo->b_data[finfo->b_used++] = c;

    if(finfo->b_used >= finfo->b_size - 1) {
      /* if it is important, extend buffer space for file data */
      char *tmp = realloc(finfo->b_data,
                          finfo->b_size + FTP_BUFFER_ALLOCSIZE);
      if(tmp) {
        finfo->b_size += FTP_BUFFER_ALLOCSIZE;
        finfo->b_data = tmp;
      }
      else {
        Curl_fileinfo_cleanup(parser->file_data);
        parser->file_data = NULL;
        parser->error = CURLE_OUT_OF_MEMORY;
        goto fail;
      }
    }

    switch(parser->os_type) {
    case OS_TYPE_UNIX:
      switch(parser->state.UNIX.main) {
      case PL_UNIX_TOTALSIZE:
        switch(parser->state.UNIX.sub.total_dirsize) {
        case PL_UNIX_TOTALSIZE_INIT:
          if(c == 't') {
            parser->state.UNIX.sub.total_dirsize = PL_UNIX_TOTALSIZE_READING;
            parser->item_length++;
          }
          else {
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            /* start FSM again not considering size of directory */
            finfo->b_used = 0;
            continue;
          }
          break;
        case PL_UNIX_TOTALSIZE_READING:
          parser->item_length++;
          if(c == '\r') {
            parser->item_length--;
            finfo->b_used--;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_length - 1] = 0;
            if(strncmp("total ", finfo->b_data, 6) == 0) {
              char *endptr = finfo->b_data + 6;
              /* here we can deal with directory size, pass the leading white
                 spaces and then the digits */
              while(ISSPACE(*endptr))
                endptr++;
              while(ISDIGIT(*endptr))
                endptr++;
              if(*endptr != 0) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              parser->state.UNIX.main = PL_UNIX_FILETYPE;
              finfo->b_used = 0;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        }
        break;
      case PL_UNIX_FILETYPE:
        switch(c) {
        case '-':
          finfo->filetype = CURLFILETYPE_FILE;
          break;
        case 'd':
          finfo->filetype = CURLFILETYPE_DIRECTORY;
          break;
        case 'l':
          finfo->filetype = CURLFILETYPE_SYMLINK;
          break;
        case 'p':
          finfo->filetype = CURLFILETYPE_NAMEDPIPE;
          break;
        case 's':
          finfo->filetype = CURLFILETYPE_SOCKET;
          break;
        case 'c':
          finfo->filetype = CURLFILETYPE_DEVICE_CHAR;
          break;
        case 'b':
          finfo->filetype = CURLFILETYPE_DEVICE_BLOCK;
          break;
        case 'D':
          finfo->filetype = CURLFILETYPE_DOOR;
          break;
        default:
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        parser->state.UNIX.main = PL_UNIX_PERMISSION;
        parser->item_length = 0;
        parser->item_offset = 1;
        break;
      case PL_UNIX_PERMISSION:
        parser->item_length++;
        if(parser->item_length <= 9) {
          if(!strchr("rwx-tTsS", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 10) {
          unsigned int perm;
          if(c != ' ') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          finfo->b_data[10] = 0; /* terminate permissions */
          perm = ftp_pl_get_permission(finfo->b_data + parser->item_offset);
          if(perm & FTP_LP_MALFORMATED_PERM) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_PERM;
          parser->file_data->info.perm = perm;
          parser->offsets.perm = parser->item_offset;

          parser->item_length = 0;
          parser->state.UNIX.main = PL_UNIX_HLINKS;
          parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_PRESPACE;
        }
        break;
      case PL_UNIX_HLINKS:
        switch(parser->state.UNIX.sub.hlinks) {
        case PL_UNIX_HLINKS_PRESPACE:
          if(c != ' ') {
            if(c >= '0' && c <= '9') {
              parser->item_offset = finfo->b_used - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_HLINKS_NUMBER:
          parser->item_length ++;
          if(c == ' ') {
            char *p;
            long int hlinks;
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            hlinks = strtol(finfo->b_data + parser->item_offset, &p, 10);
            if(p[0] == '\0' && hlinks != LONG_MAX && hlinks != LONG_MIN) {
              parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_HLINKCOUNT;
              parser->file_data->info.hardlinks = hlinks;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_USER;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PRESPACE;
          }
          else if(c < '0' || c > '9') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_USER:
        switch(parser->state.UNIX.sub.user) {
        case PL_UNIX_USER_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PARSING;
          }
          break;
        case PL_UNIX_USER_PARSING:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.user = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_GROUP;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_GROUP:
        switch(parser->state.UNIX.sub.group) {
        case PL_UNIX_GROUP_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_NAME;
          }
          break;
        case PL_UNIX_GROUP_NAME:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.group = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_SIZE;
            parser->state.UNIX.sub.size = PL_UNIX_SIZE_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_SIZE:
        switch(parser->state.UNIX.sub.size) {
        case PL_UNIX_SIZE_PRESPACE:
          if(c != ' ') {
            if(c >= '0' && c <= '9') {
              parser->item_offset = finfo->b_used - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.size = PL_UNIX_SIZE_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_SIZE_NUMBER:
          parser->item_length++;
          if(c == ' ') {
            char *p;
            curl_off_t fsize;
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            if(!curlx_strtoofft(finfo->b_data + parser->item_offset,
                                &p, 10, &fsize)) {
              if(p[0] == '\0' && fsize != CURL_OFF_T_MAX &&
                 fsize != CURL_OFF_T_MIN) {
                parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
                parser->file_data->info.size = fsize;
              }
              parser->item_length = 0;
              parser->item_offset = 0;
              parser->state.UNIX.main = PL_UNIX_TIME;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART1;
            }
          }
          else if(!ISDIGIT(c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_TIME:
        switch(parser->state.UNIX.sub.time) {
        case PL_UNIX_TIME_PREPART1:
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->item_offset = finfo->b_used -1;
              parser->item_length = 1;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART1;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART1:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART2;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART2:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART2;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART2:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART3;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART3:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART3;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART3:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length -1] = 0;
            parser->offsets.time = parser->item_offset;
            /*
              if(ftp_pl_gettime(parser, finfo->b_data + parser->item_offset)) {
                parser->file_data->flags |= CURLFINFOFLAG_KNOWN_TIME;
              }
            */
            if(finfo->filetype == CURLFILETYPE_SYMLINK) {
              parser->state.UNIX.main = PL_UNIX_SYMLINK;
              parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRESPACE;
            }
            else {
              parser->state.UNIX.main = PL_UNIX_FILENAME;
              parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_PRESPACE;
            }
          }
          else if(!ISALNUM(c) && c != '.' && c != ':') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_FILENAME:
        switch(parser->state.UNIX.sub.filename) {
        case PL_UNIX_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_NAME;
          }
          break;
        case PL_UNIX_FILENAME_NAME:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_WINDOWSEOL;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          break;
        case PL_UNIX_FILENAME_WINDOWSEOL:
          if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_SYMLINK:
        switch(parser->state.UNIX.sub.symlink) {
        case PL_UNIX_SYMLINK_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_NAME:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET1;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET1:
          parser->item_length++;
          if(c == '-') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET2;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET2:
          parser->item_length++;
          if(c == '>') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET3;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET3:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET4;
            /* now place where is symlink following */
            finfo->b_data[parser->item_offset + parser->item_length - 4] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->item_length = 0;
            parser->item_offset = 0;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET4:
          if(c != '\r' && c != '\n') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_TARGET;
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_TARGET:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_WINDOWSEOL;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          break;
        case PL_UNIX_SYMLINK_WINDOWSEOL:
          if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    case OS_TYPE_WIN_NT:
      switch(parser->state.NT.main) {
      case PL_WINNT_DATE:
        parser->item_length++;
        if(parser->item_length < 9) {
          if(!strchr("0123456789-", c)) { /* only simple control */
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 9) {
          if(c == ' ') {
            parser->state.NT.main = PL_WINNT_TIME;
            parser->state.NT.sub.time = PL_WINNT_TIME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else {
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        break;
      case PL_WINNT_TIME:
        parser->item_length++;
        switch(parser->state.NT.sub.time) {
        case PL_WINNT_TIME_PRESPACE:
          if(!ISSPACE(c)) {
            parser->state.NT.sub.time = PL_WINNT_TIME_TIME;
          }
          break;
        case PL_WINNT_TIME_TIME:
          if(c == ' ') {
            parser->offsets.time = parser->item_offset;
            finfo->b_data[parser->item_offset + parser->item_length -1] = 0;
            parser->state.NT.main = PL_WINNT_DIRORSIZE;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_PRESPACE;
            parser->item_length = 0;
          }
          else if(!strchr("APM0123456789:", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_WINNT_DIRORSIZE:
        switch(parser->state.NT.sub.dirorsize) {
        case PL_WINNT_DIRORSIZE_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_CONTENT;
          }
          break;
        case PL_WINNT_DIRORSIZE_CONTENT:
          parser->item_length ++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            if(strcmp("<DIR>", finfo->b_data + parser->item_offset) == 0) {
              finfo->filetype = CURLFILETYPE_DIRECTORY;
              finfo->size = 0;
            }
            else {
              char *endptr;
              if(curlx_strtoofft(finfo->b_data +
                                 parser->item_offset,
                                 &endptr, 10, &finfo->size)) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              /* correct file type */
              parser->file_data->info.filetype = CURLFILETYPE_FILE;
            }

            parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
            parser->item_length = 0;
            parser->state.NT.main = PL_WINNT_FILENAME;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        }
        break;
      case PL_WINNT_FILENAME:
        switch(parser->state.NT.sub.filename) {
        case PL_WINNT_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used -1;
            parser->item_length = 1;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_CONTENT;
          }
          break;
        case PL_WINNT_FILENAME_CONTENT:
          parser->item_length++;
          if(c == '\r') {
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_WINEOL;
            finfo->b_data[finfo->b_used - 1] = 0;
          }
          else if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            finfo->b_data[finfo->b_used - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        case PL_WINNT_FILENAME_WINEOL:
          if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    default:
      retsize = bufflen + 1;
      goto fail;
    }

    i++;
  }
  return retsize;

fail:

  /* Clean up any allocated memory. */
  if(parser->file_data) {
    Curl_fileinfo_cleanup(parser->file_data);
    parser->file_data = NULL;
  }

  return retsize;
}